

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_device_info_add_native_data_format
               (ma_device_info_conflict *pDeviceInfo,ma_format format,ma_uint32 channels,
               ma_uint32 sampleRate,ma_uint32 flags)

{
  ma_uint32 flags_local;
  ma_uint32 sampleRate_local;
  ma_uint32 channels_local;
  ma_format format_local;
  ma_device_info_conflict *pDeviceInfo_local;
  
  if ((pDeviceInfo != (ma_device_info_conflict *)0x0) && (pDeviceInfo->nativeDataFormatCount < 0x40)
     ) {
    pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].format = format;
    pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].channels = channels;
    pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].sampleRate = sampleRate;
    pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].flags = flags;
    pDeviceInfo->nativeDataFormatCount = pDeviceInfo->nativeDataFormatCount + 1;
  }
  return;
}

Assistant:

MA_API void ma_device_info_add_native_data_format(ma_device_info* pDeviceInfo, ma_format format, ma_uint32 channels, ma_uint32 sampleRate, ma_uint32 flags)
{
    if (pDeviceInfo == NULL) {
        return;
    }

    if (pDeviceInfo->nativeDataFormatCount < ma_countof(pDeviceInfo->nativeDataFormats)) {
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].format     = format;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].channels   = channels;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].sampleRate = sampleRate;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].flags      = flags;
        pDeviceInfo->nativeDataFormatCount += 1;
    }
}